

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire.hpp
# Opt level: O2

string * __thiscall wire::string::operator=(string *this,char **t)

{
  string local_30 [32];
  
  string((string *)local_30,t);
  std::__cxx11::string::operator=((string *)this,local_30);
  std::__cxx11::string::~string(local_30);
  return this;
}

Assistant:

string &operator=( const T &t )
        {
            this->assign( string(t) );
            return *this;
        }